

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

Pooling3DLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_pooling3d(NeuralNetworkLayer *this)

{
  bool bVar1;
  Pooling3DLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_pooling3d(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_pooling3d(this);
    this_00 = (Pooling3DLayerParams *)operator_new(0x50);
    Pooling3DLayerParams::Pooling3DLayerParams(this_00);
    (this->layer_).pooling3d_ = this_00;
  }
  return (Pooling3DLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::Pooling3DLayerParams* NeuralNetworkLayer::mutable_pooling3d() {
  if (!has_pooling3d()) {
    clear_layer();
    set_has_pooling3d();
    layer_.pooling3d_ = new ::CoreML::Specification::Pooling3DLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.pooling3d)
  return layer_.pooling3d_;
}